

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O3

void cfd::core::Amount::CheckValidAmount(int64_t satoshi_amount)

{
  CfdException *this;
  ulong in_RDI;
  long local_48;
  undefined1 local_40 [32];
  
  if (in_RDI < 0x775f05a074001) {
    return;
  }
  local_40._0_8_ = "cfdcore_amount.cpp";
  local_40._8_4_ = 0x33;
  local_40._16_8_ = "CheckValidAmount";
  logger::log<long&>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                     "Amount out of range. amount={}.",&local_48);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Amount out of range.","");
  CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Amount::CheckValidAmount(int64_t satoshi_amount) {
  if (!IsValidAmount(satoshi_amount)) {
    warn(CFD_LOG_SOURCE, "Amount out of range. amount={}.", satoshi_amount);
    throw CfdException(kCfdOutOfRangeError, "Amount out of range.");
  }
}